

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void __thiscall
QtPromisePrivate::
PromiseDataBase<std::vector<int,_std::allocator<int>_>,_void_(const_std::vector<int,_std::allocator<int>_>_&)>
::~PromiseDataBase(PromiseDataBase<std::vector<int,_std::allocator<int>_>,_void_(const_std::vector<int,_std::allocator<int>_>_&)>
                   *this)

{
  this->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0014bcf8;
  std::__exception_ptr::exception_ptr::~exception_ptr(&(this->m_error).m_data);
  QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>_>
  ::~QArrayDataPointer(&(this->m_catchers).d);
  QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_std::vector<int,_std::allocator<int>_>_&)>_>_>
  ::~QArrayDataPointer
            ((QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_std::vector<int,_std::allocator<int>_>_&)>_>_>
              *)&this->m_handlers);
  QReadWriteLock::~QReadWriteLock(&this->m_lock);
  return;
}

Assistant:

virtual ~PromiseDataBase() { }